

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FIReader.cpp
# Opt level: O3

shared_ptr<const_Assimp::FIValue> __thiscall
Assimp::FIShortDecoder::decode(FIShortDecoder *this,uint8_t *data,size_t len)

{
  ushort uVar1;
  FIShortDecoder FVar2;
  DeadlyImportError *this_00;
  ulong in_RCX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  ulong uVar4;
  shared_ptr<Assimp::FIShortValue> sVar5;
  shared_ptr<const_Assimp::FIValue> sVar6;
  vector<short,_std::allocator<short>_> value;
  int16_t v;
  vector<short,_std::allocator<short>_> local_68;
  ushort local_48;
  undefined6 uStack_46;
  FIShortDecoder FStack_40;
  
  if ((in_RCX & 1) == 0) {
    local_68.super__Vector_base<short,_std::allocator<short>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_68.super__Vector_base<short,_std::allocator<short>_>._M_impl.super__Vector_impl_data.
    _M_finish = (short *)0x0;
    local_68.super__Vector_base<short,_std::allocator<short>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (short *)0x0;
    std::vector<short,_std::allocator<short>_>::reserve(&local_68,in_RCX >> 1);
    if (in_RCX != 0) {
      uVar4 = 0;
      do {
        uVar1 = *(ushort *)(len + uVar4 * 2);
        local_48 = uVar1 << 8 | uVar1 >> 8;
        if (local_68.super__Vector_base<short,_std::allocator<short>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_68.super__Vector_base<short,_std::allocator<short>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<short,std::allocator<short>>::_M_realloc_insert<short_const&>
                    ((vector<short,std::allocator<short>> *)&local_68,
                     (iterator)
                     local_68.super__Vector_base<short,_std::allocator<short>_>._M_impl.
                     super__Vector_impl_data._M_finish,(short *)&local_48);
        }
        else {
          *local_68.super__Vector_base<short,_std::allocator<short>_>._M_impl.
           super__Vector_impl_data._M_finish = local_48;
          local_68.super__Vector_base<short,_std::allocator<short>_>._M_impl.super__Vector_impl_data
          ._M_finish = local_68.super__Vector_base<short,_std::allocator<short>_>._M_impl.
                       super__Vector_impl_data._M_finish + 1;
        }
        uVar4 = uVar4 + 1;
      } while (in_RCX >> 1 != uVar4);
    }
    sVar5 = FIShortValue::create((FIShortValue *)&local_48,&local_68);
    _Var3 = sVar5.super___shared_ptr<Assimp::FIShortValue,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi;
    FVar2._2_6_ = uStack_46;
    FVar2._0_2_ = local_48;
    *this = FVar2;
    this[1] = FStack_40;
    if (local_68.super__Vector_base<short,_std::allocator<short>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_68.super__Vector_base<short,_std::allocator<short>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_68.super__Vector_base<short,_std::allocator<short>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_68.super__Vector_base<short,_std::allocator<short>_>._M_impl.
                            super__Vector_impl_data._M_start);
      _Var3._M_pi = extraout_RDX;
    }
    sVar6.super___shared_ptr<const_Assimp::FIValue,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         _Var3._M_pi;
    sVar6.super___shared_ptr<const_Assimp::FIValue,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)this;
    return (shared_ptr<const_Assimp::FIValue>)
           sVar6.super___shared_ptr<const_Assimp::FIValue,_(__gnu_cxx::_Lock_policy)2>;
  }
  this_00 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
  DeadlyImportError::DeadlyImportError(this_00,(string *)&parseErrorMessage_abi_cxx11_);
  __cxa_throw(this_00,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

virtual std::shared_ptr<const FIValue> decode(const uint8_t *data, size_t len) /*override*/ {
        if (len & 1) {
            throw DeadlyImportError(parseErrorMessage);
        }
        std::vector<int16_t> value;
        size_t numShorts = len / 2;
        value.reserve(numShorts);
        for (size_t i = 0; i < numShorts; ++i) {
            int16_t v = (data[0] << 8) | data[1];
            value.push_back(v);
            data += 2;
        }
        return FIShortValue::create(std::move(value));
    }